

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

void upb_inttable_clear(upb_inttable *t)

{
  t->array_count = 0;
  memset(t->array,0xff,(ulong)t->array_size << 3);
  memset(t->presence_mask,0,(ulong)(t->array_size + 7 >> 3));
  (t->t).count = 0;
  memset((t->t).entries,0,(ulong)((t->t).mask + 1) * 0x18);
  return;
}

Assistant:

void upb_inttable_clear(upb_inttable* t) {
  // Clear the array part.
  size_t array_bytes = t->array_size * sizeof(upb_value);
  t->array_count = 0;
  // Clear the array by setting all bits to 1, as UINT64_MAX is the sentinel
  // value for an empty array.
  memset(mutable_array(t), 0xff, array_bytes);
  // Clear the presence mask array.
  memset((uint8_t*)t->presence_mask, 0, presence_mask_arr_size(t->array_size));
  // Clear the table part.
  size_t bytes = upb_table_size(&t->t) * sizeof(upb_tabent);
  t->t.count = 0;
  memset((char*)t->t.entries, 0, bytes);
}